

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

int Extra_bddSuppCheckContainment
              (DdManager *dd,DdNode *bL,DdNode *bH,DdNode **bLarge,DdNode **bSmall)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  DdHalfWord local_54;
  int TopVar;
  int fHcontainsL;
  int fLcontainsH;
  DdNode *bSH;
  DdNode *bSL;
  DdNode **bSmall_local;
  DdNode **bLarge_local;
  DdNode *bH_local;
  DdNode *bL_local;
  DdManager *dd_local;
  
  bVar2 = true;
  bVar1 = true;
  _fHcontainsL = bH;
  bSH = bL;
  if (bL != bH) {
    do {
      bVar3 = true;
      if (bSH == dd->one) {
        bVar3 = _fHcontainsL != dd->one;
      }
      if (!bVar3) {
LAB_00a56088:
        if ((bVar1) && (bVar2)) {
          __assert_fail("!fHcontainsL || !fLcontainsH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddMisc.c"
                        ,0x1fa,
                        "int Extra_bddSuppCheckContainment(DdManager *, DdNode *, DdNode *, DdNode **, DdNode **)"
                       );
        }
        if (bVar1) {
          *bLarge = bH;
          *bSmall = bL;
        }
        else {
          *bLarge = bL;
          *bSmall = bH;
        }
        return 1;
      }
      if (bSH == dd->one) {
        bVar2 = false;
        if (!bVar1) {
          return 0;
        }
        goto LAB_00a56088;
      }
      if (_fHcontainsL == dd->one) {
        bVar1 = false;
        if (!bVar2) {
          return 0;
        }
        goto LAB_00a56088;
      }
      if (dd->perm[bSH->index] < dd->perm[_fHcontainsL->index]) {
        local_54 = bSH->index;
      }
      else {
        local_54 = _fHcontainsL->index;
      }
      if ((local_54 == bSH->index) && (local_54 == _fHcontainsL->index)) {
        bSH = (bSH->type).kids.T;
        _fHcontainsL = (_fHcontainsL->type).kids.T;
      }
      else if (local_54 == bSH->index) {
        bVar1 = false;
        bSH = (bSH->type).kids.T;
      }
      else {
        bVar2 = false;
        _fHcontainsL = (_fHcontainsL->type).kids.T;
      }
    } while ((bVar1) || (bVar2));
  }
  return 0;
}

Assistant:

int Extra_bddSuppCheckContainment( DdManager * dd, DdNode * bL, DdNode * bH, DdNode ** bLarge, DdNode ** bSmall )
{
    DdNode * bSL = bL;
    DdNode * bSH = bH;
    int fLcontainsH = 1;
    int fHcontainsL = 1;
    int TopVar;
    
    if ( bSL == bSH )
        return 0;

    while ( bSL != b1 || bSH != b1 )
    {
        if ( bSL == b1 )
        { // Low component has no vars; High components has some vars
            fLcontainsH = 0;
            if ( fHcontainsL == 0 )
                return 0;
            else
                break;
        }

        if ( bSH == b1 )
        { // similarly
            fHcontainsL = 0;
            if ( fLcontainsH == 0 )
                return 0;
            else
                break;
        }

        // determine the topmost var of the supports by comparing their levels
        if ( dd->perm[bSL->index] < dd->perm[bSH->index] )
            TopVar = bSL->index;
        else
            TopVar = bSH->index;

        if ( TopVar == bSL->index && TopVar == bSH->index ) 
        { // they are on the same level
            // it does not tell us anything about their containment
            // skip this var
            bSL = cuddT(bSL);
            bSH = cuddT(bSH);
        }
        else if ( TopVar == bSL->index ) // and TopVar != bSH->index
        { // Low components is higher and contains more vars
            // it is not possible that High component contains Low
            fHcontainsL = 0;
            // skip this var
            bSL = cuddT(bSL);
        }
        else // if ( TopVar == bSH->index ) // and TopVar != bSL->index
        { // similarly
            fLcontainsH = 0;
            // skip this var
            bSH = cuddT(bSH);
        }

        // check the stopping condition
        if ( !fHcontainsL && !fLcontainsH )
            return 0;
    }
    // only one of them can be true at the same time
    assert( !fHcontainsL || !fLcontainsH );
    if ( fHcontainsL )
    {
        *bLarge = bH;
        *bSmall = bL;
    }
    else // fLcontainsH
    {
        *bLarge = bL;
        *bSmall = bH;
    }
    return 1;
}